

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
FlushDictionary(StandardColumnWriter<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                *this,PrimitiveColumnWriterState *state_p,ColumnWriterStatistics *stats)

{
  PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *this_00;
  function<void_(const_duckdb::double_na_equal_&,_const_double_&)> *in_RDI;
  StandardColumnWriterState<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *state;
  idx_t in_stack_000001e8;
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
  *in_stack_000001f0;
  PrimitiveColumnWriterState *in_stack_000001f8;
  PrimitiveColumnWriter *in_stack_00000200;
  unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
  *in_stack_ffffffffffffff48;
  ColumnWriterState *in_stack_ffffffffffffff50;
  anon_class_16_2_bbc851bb *in_stack_ffffffffffffff58;
  function<void_(const_duckdb::double_na_equal_&,_const_double_&)> *fun;
  double *in_stack_ffffffffffffff70;
  unsigned_long *in_stack_ffffffffffffff78;
  PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *this_01;
  undefined1 local_28 [40];
  
  local_28._8_8_ =
       ColumnWriterState::
       Cast<duckdb::StandardColumnWriterState<duckdb::double_na_equal,double,duckdb::FloatingPointOperator>>
                 (in_stack_ffffffffffffff50);
  PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::GetSize
            (&((StandardColumnWriterState<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                *)local_28._8_8_)->dictionary);
  ParquetWriter::BloomFilterFalsePositiveRatio
            (*(ParquetWriter **)((long)&(in_RDI->super__Function_base)._M_functor + 8));
  fun = (function<void_(const_duckdb::double_na_equal_&,_const_double_&)> *)local_28;
  make_uniq<duckdb::ParquetBloomFilter,unsigned_long,double>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>::
  operator=((unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
             *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
               *)0x5fd96c);
  this_00 = (PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *)
            (local_28._8_8_ + 0xe8);
  this_01 = (PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *)
            (local_28 + 0x10);
  std::function<void(duckdb::double_na_equal_const&,double_const&)>::
  function<duckdb::StandardColumnWriter<duckdb::double_na_equal,double,duckdb::FloatingPointOperator>::FlushDictionary(duckdb::PrimitiveColumnWriterState&,duckdb::ColumnWriterStatistics*)::_lambda(duckdb::double_na_equal_const&,double_const&)_1_,void>
            (in_RDI,in_stack_ffffffffffffff58);
  PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
  IterateValues<duckdb::double_na_equal,_0>(this_00,fun);
  std::function<void_(const_duckdb::double_na_equal_&,_const_double_&)>::~function
            ((function<void_(const_duckdb::double_na_equal_&,_const_double_&)> *)0x5fd9c8);
  PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
  GetTargetMemoryStream(this_01);
  PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::GetSize
            ((PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *)
             (local_28._8_8_ + 0xe8));
  PrimitiveColumnWriter::WriteDictionary
            (in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
  unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::~unique_ptr
            ((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
             0x5fda22);
  return;
}

Assistant:

void FlushDictionary(PrimitiveColumnWriterState &state_p, ColumnWriterStatistics *stats) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		D_ASSERT(state.encoding == duckdb_parquet::Encoding::RLE_DICTIONARY);

		state.bloom_filter =
		    make_uniq<ParquetBloomFilter>(state.dictionary.GetSize(), writer.BloomFilterFalsePositiveRatio());

		state.dictionary.IterateValues([&](const SRC &src_value, const TGT &tgt_value) {
			// update the statistics
			OP::template HandleStats<SRC, TGT>(stats, tgt_value);
			// update the bloom filter
			auto hash = OP::template XXHash64<SRC, TGT>(tgt_value);
			state.bloom_filter->FilterInsert(hash);
		});

		// flush the dictionary page and add it to the to-be-written pages
		WriteDictionary(state, state.dictionary.GetTargetMemoryStream(), state.dictionary.GetSize());
		// bloom filter will be queued for writing in ParquetWriter::BufferBloomFilter one level up
	}